

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QListWidgetItem * __thiscall QListModel::take(QListModel *this,int row)

{
  QListWidgetItem *pQVar1;
  ulong i;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((row < 0) || (i = (ulong)(uint)row, (ulong)(this->items).d.size <= i)) {
    pQVar1 = (QListWidgetItem *)0x0;
  }
  else {
    local_38 = 0xffffffffffffffff;
    local_30 = 0;
    uStack_28 = 0;
    QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_38,row);
    pQVar1 = (this->items).d.ptr[i];
    pQVar1->d->theid = -1;
    pQVar1->view = (QListWidget *)0x0;
    pQVar1 = QList<QListWidgetItem_*>::takeAt(&this->items,i);
    QAbstractItemModel::endRemoveRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem *QListModel::take(int row)
{
    if (row < 0 || row >= items.size())
        return nullptr;

    beginRemoveRows(QModelIndex(), row, row);
    items.at(row)->d->theid = -1;
    items.at(row)->view = nullptr;
    QListWidgetItem *item = items.takeAt(row);
    endRemoveRows();
    return item;
}